

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_push_custom(nk_command_buffer *b,nk_rect r,nk_command_custom_callback cb,nk_handle usr)

{
  float fVar1;
  void *pvVar2;
  float local_48;
  float local_44;
  nk_rect *c;
  nk_command_custom *cmd;
  nk_command_custom_callback cb_local;
  nk_command_buffer *b_local;
  nk_handle usr_local;
  nk_rect r_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x23be,
                  "void nk_push_custom(struct nk_command_buffer *, struct nk_rect, nk_command_custom_callback, nk_handle)"
                 );
  }
  if (b != (nk_command_buffer *)0x0) {
    usr_local.id = (int)r.x;
    usr_local._4_4_ = r.y;
    r_local.x = r.w;
    r_local.y = r.h;
    if (b->use_clipping != 0) {
      fVar1 = (b->clip).w;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      fVar1 = (b->clip).h;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      if ((float)usr_local.id + r_local.x < (b->clip).x) {
        return;
      }
      if ((b->clip).x + (b->clip).w < (float)usr_local.id) {
        return;
      }
      if ((float)usr_local._4_4_ + r_local.y < (b->clip).y) {
        return;
      }
      if ((b->clip).y + (b->clip).h < (float)usr_local._4_4_) {
        return;
      }
    }
    pvVar2 = nk_command_buffer_push(b,NK_COMMAND_CUSTOM,0x28);
    if (pvVar2 != (void *)0x0) {
      *(short *)((long)pvVar2 + 0x10) = (short)(int)(float)usr_local.id;
      *(short *)((long)pvVar2 + 0x12) = (short)(int)usr_local._4_4_;
      if (r_local.x <= 0.0) {
        local_44 = 0.0;
      }
      else {
        local_44 = r_local.x;
      }
      *(short *)((long)pvVar2 + 0x14) = (short)(int)local_44;
      if (r_local.y <= 0.0) {
        local_48 = 0.0;
      }
      else {
        local_48 = r_local.y;
      }
      *(short *)((long)pvVar2 + 0x16) = (short)(int)local_48;
      *(nk_handle *)((long)pvVar2 + 0x18) = usr;
      *(nk_command_custom_callback *)((long)pvVar2 + 0x20) = cb;
    }
  }
  return;
}

Assistant:

NK_API void
nk_push_custom(struct nk_command_buffer *b, struct nk_rect r,
    nk_command_custom_callback cb, nk_handle usr)
{
    struct nk_command_custom *cmd;
    NK_ASSERT(b);
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    cmd = (struct nk_command_custom*)
        nk_command_buffer_push(b, NK_COMMAND_CUSTOM, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
    cmd->callback_data = usr;
    cmd->callback = cb;
}